

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

TokenList * slang::syntax::deepClone(TokenList *node,BumpAllocator *alloc)

{
  int iVar1;
  undefined4 extraout_var;
  TokenList *pTVar2;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  Info *extraout_RDX_01;
  Token *args;
  long lVar3;
  Token *ele;
  pointer this;
  SmallVector<slang::parsing::Token,_2UL> buffer;
  Token local_70;
  SmallVector<slang::parsing::Token,_2UL> local_60;
  
  SmallVector<slang::parsing::Token,_2UL>::SmallVector
            (&local_60,
             (node->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
             _M_extent_value);
  this = (node->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  src = extraout_RDX;
  for (lVar3 = (node->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
               _M_extent_value << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    local_70 = parsing::Token::deepClone(this,alloc);
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
              (&local_60.super_SmallVectorBase<slang::parsing::Token>,&local_70);
    this = this + 1;
    src = extraout_RDX_00;
  }
  iVar1 = SmallVectorBase<slang::parsing::Token>::copy
                    (&local_60.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)alloc,
                     src);
  local_70.rawLen = extraout_var;
  local_70.kind = (short)iVar1;
  local_70._2_1_ = (char)((uint)iVar1 >> 0x10);
  local_70.numFlags.raw = (char)((uint)iVar1 >> 0x18);
  args = &local_70;
  local_70.info = extraout_RDX_01;
  pTVar2 = BumpAllocator::
           emplace<slang::syntax::TokenList,std::span<slang::parsing::Token,18446744073709551615ul>>
                     (alloc,(span<slang::parsing::Token,_18446744073709551615UL> *)args);
  SmallVectorBase<slang::parsing::Token>::cleanup
            (&local_60.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)args);
  return pTVar2;
}

Assistant:

inline TokenList* deepClone(const TokenList& node, BumpAllocator& alloc) {
    SmallVector<parsing::Token> buffer(node.size(), UninitializedTag());
    for (const auto& ele : node) {
        buffer.push_back(ele.deepClone(alloc));
    }
    return alloc.emplace<TokenList>(buffer.copy(alloc));
}